

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O3

void __thiscall
ANN::set_labels(ANN *this,LayerType label_type,
               initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *labels)

{
  pointer pLVar1;
  ulong uVar2;
  
  if (label_type == OutputLayer) {
    pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (ulong)((int)((ulong)((long)(this->m_layers).
                                        super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pLVar1) >> 3) *
                    -0x45d1745d - 1);
  }
  else {
    pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
  }
  Layer::set_labels(pLVar1 + uVar2,labels);
  return;
}

Assistant:

void ANN::set_labels(LayerType label_type, const std::initializer_list<std::string>& labels){
    uint index;
    switch (label_type)
    {
    case InputLayer:
        index=0;
        break;
    case OutputLayer:
        index=m_layers.size()-1;
        break;
    default: break;
    }
    m_layers[index].set_labels(labels);
}